

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

type_conflict2 __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
          (Memory *this,Source segment,uint16_t offset)

{
  byte bVar1;
  Segments *pSVar2;
  uint uVar3;
  Segments *pSVar4;
  undefined3 in_register_00000031;
  int iVar5;
  
  iVar5 = CONCAT31(in_register_00000031,segment);
  pSVar2 = this->segments_;
  pSVar4 = pSVar2;
  if (iVar5 != 8) {
    if (iVar5 == 9) {
      pSVar4 = (Segments *)&pSVar2->cs_base_;
    }
    else if (iVar5 == 10) {
      pSVar4 = (Segments *)&pSVar2->ss_base_;
    }
    else {
      pSVar4 = (Segments *)&pSVar2->ds_base_;
    }
  }
  uVar3 = pSVar4->es_base_ + (uint)offset & 0xfffff;
  if (offset == 0xffff) {
    if (segment != ES) {
      if (segment == CS) {
        pSVar2 = (Segments *)&pSVar2->cs_base_;
      }
      else if (segment == SS) {
        pSVar2 = (Segments *)&pSVar2->ss_base_;
      }
      else {
        pSVar2 = (Segments *)&pSVar2->ds_base_;
      }
    }
    bVar1 = (this->memory)._M_elems[uVar3];
    uVar3 = (uint)(this->memory)._M_elems[pSVar2->es_base_ & 0xfffff];
  }
  else {
    if (uVar3 != 0xfffff) {
      return *(type_conflict2 *)((this->memory)._M_elems + uVar3);
    }
    bVar1 = (this->memory)._M_elems[0xfffff];
    uVar3 = *(uint *)(this->memory)._M_elems;
  }
  return (ushort)(uVar3 << 8) | (ushort)bVar1;
}

Assistant:

uint32_t segment_base(InstructionSet::x86::Source segment) {
			using Source = InstructionSet::x86::Source;
			switch(segment) {
				default:			return segments_.ds_base_;
				case Source::ES:	return segments_.es_base_;
				case Source::CS:	return segments_.cs_base_;
				case Source::SS:	return segments_.ss_base_;
			}
		}